

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int listener_get(nng_listener lid,char *name,void *v,size_t *szp,nni_type t)

{
  int iVar1;
  nni_listener *pnStack_38;
  int rv;
  nni_listener *l;
  size_t *psStack_28;
  nni_type t_local;
  size_t *szp_local;
  void *v_local;
  char *name_local;
  nng_listener lid_local;
  
  l._4_4_ = t;
  psStack_28 = szp;
  szp_local = (size_t *)v;
  v_local = name;
  name_local._0_4_ = lid.id;
  name_local._4_4_ = nni_listener_find(&stack0xffffffffffffffc8,lid.id);
  if (name_local._4_4_ == 0) {
    iVar1 = nni_listener_getopt(pnStack_38,(char *)v_local,szp_local,psStack_28,l._4_4_);
    nni_listener_rele(pnStack_38);
    name_local._4_4_ = iVar1;
  }
  return name_local._4_4_;
}

Assistant:

static int
listener_get(
    nng_listener lid, const char *name, void *v, size_t *szp, nni_type t)
{
	nni_listener *l;
	int           rv;

	if ((rv = nni_listener_find(&l, lid.id)) != 0) {
		return (rv);
	}
	rv = nni_listener_getopt(l, name, v, szp, t);
	nni_listener_rele(l);
	return (rv);
}